

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O3

double calc_kurtosis<float,long_double>
                 (size_t *ix_arr,size_t st,size_t end,float *x,MissingAction missing_action)

{
  size_t *psVar1;
  bool bVar2;
  size_t sVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  uint uVar7;
  long lVar8;
  longdouble lVar9;
  longdouble lVar10;
  longdouble lVar11;
  longdouble lVar12;
  longdouble local_e8;
  longdouble local_dc;
  longdouble local_d0;
  longdouble local_c4;
  long local_a8;
  ushort uStack_a0;
  long local_98;
  short sStack_90;
  long local_88;
  ushort uStack_80;
  long local_78;
  short sStack_70;
  
  if (missing_action != Fail) {
    if (end < st) {
      return -INFINITY;
    }
    lVar12 = (longdouble)0;
    sVar3 = st;
    lVar4 = 0;
    local_e8 = lVar12;
    local_dc = lVar12;
    local_c4 = lVar12;
    do {
      lVar6 = lVar4;
      if ((uint)ABS(x[ix_arr[sVar3]]) < 0x7f800000) {
        lVar6 = lVar4 + 1;
        lVar9 = (longdouble)lVar6 + (longdouble)(float)(&DAT_0036e0d8)[lVar6 < 0];
        lVar10 = (longdouble)x[ix_arr[sVar3]] - local_e8;
        lVar11 = lVar10 / lVar9;
        lVar10 = ((longdouble)lVar4 + (longdouble)(float)(&DAT_0036e0d8)[lVar4 < 0]) * lVar11 *
                 lVar10;
        local_dc = local_dc +
                   lVar11 * (longdouble)-4.0 * local_c4 +
                   (lVar9 * lVar9 + (longdouble)-3.0 * lVar9 + (longdouble)3.0) *
                   lVar11 * lVar11 * lVar10 + lVar11 * lVar11 * (longdouble)6.0 * lVar12;
        local_e8 = local_e8 + lVar11;
        local_c4 = local_c4 +
                   (longdouble)-3.0 * lVar11 * lVar12 + (lVar9 + (longdouble)-2.0) * lVar11 * lVar10
        ;
        lVar12 = lVar10 + lVar12;
      }
      sVar3 = sVar3 + 1;
      lVar4 = lVar6;
    } while (sVar3 <= end);
    if (lVar6 == 0) {
      return -INFINITY;
    }
    if (!NAN(lVar12)) {
      sStack_70 = (short)((unkuint10)lVar12 >> 0x40);
      uVar7 = (int)sStack_70 & 0x7fff;
      local_78 = SUB108(lVar12,0);
      if (((byte)((byte)((unkuint10)lVar12 >> 0x38) >> 7 & sStack_70 < 0 &
                  (uVar7 - 1 & 0xffff) < 0x7ffe |
                 (local_78 == 0 && (ulong)uVar7 == 0 ||
                 ((ulong)uVar7 - 1) + (ulong)(local_78 != 0) <
                 (ulong)(local_78 - 1U < 0x7fffffffffffffff) && sStack_70 < 0)) == 1) &&
         (bVar2 = check_more_than_two_unique_values<float>(ix_arr,st,end,x,missing_action), !bVar2))
      {
        return -INFINITY;
      }
    }
    lVar12 = (((longdouble)lVar6 + (longdouble)(float)(&DAT_0036e0d8)[lVar6 < 0]) / lVar12) *
             (local_dc / lVar12);
    uStack_80 = (ushort)((unkuint10)lVar12 >> 0x40);
    local_88 = SUB108(lVar12,0);
    if (((unkuint10)lVar12 & 0x7fff) != 0 &&
        (0x7ffd < (ushort)((uStack_80 & 0x7fff) - 1) || -1 < local_88)) {
      return -INFINITY;
    }
    goto LAB_0027c841;
  }
  lVar12 = (longdouble)0;
  local_dc = lVar12;
  if (end < st) {
LAB_0027c73e:
    sStack_90 = (short)((unkuint10)lVar12 >> 0x40);
    uVar7 = (int)sStack_90 & 0x7fff;
    local_98 = SUB108(lVar12,0);
    if ((byte)((byte)((unkuint10)lVar12 >> 0x38) >> 7 & sStack_90 < 0 &
               (uVar7 - 1 & 0xffff) < 0x7ffe |
              (local_98 == 0 && (ulong)uVar7 == 0 ||
              ((ulong)uVar7 - 1) + (ulong)(local_98 != 0) <
              (ulong)(local_98 - 1U < 0x7fffffffffffffff) && sStack_90 < 0)) == 1) {
      if (end - st < 2) {
        return -INFINITY;
      }
      uVar5 = st + 1;
      do {
        if (end < uVar5) {
          return -INFINITY;
        }
        psVar1 = ix_arr + uVar5;
        uVar5 = uVar5 + 1;
      } while ((x[*psVar1] == x[ix_arr[st]]) && (!NAN(x[*psVar1]) && !NAN(x[ix_arr[st]])));
    }
  }
  else {
    lVar12 = (longdouble)0;
    lVar4 = 0;
    local_e8 = lVar12;
    local_dc = lVar12;
    local_d0 = lVar12;
    do {
      lVar8 = lVar4 + 1;
      lVar9 = (longdouble)lVar8 + (longdouble)(float)(&DAT_0036e0d8)[lVar8 < 0];
      lVar10 = ((longdouble)x[ix_arr[st + lVar4]] - local_e8) / lVar9;
      lVar11 = ((longdouble)lVar4 + (longdouble)(float)(&DAT_0036e0d8)[lVar4 < 0]) * lVar10 *
               ((longdouble)x[ix_arr[st + lVar4]] - local_e8);
      local_dc = local_dc +
                 lVar10 * (longdouble)-4.0 * local_d0 +
                 lVar10 * lVar10 * (longdouble)6.0 * lVar12 +
                 lVar10 * lVar10 * lVar11 *
                 (lVar9 * lVar9 + (longdouble)-3.0 * lVar9 + (longdouble)3.0);
      local_e8 = local_e8 + lVar10;
      local_d0 = local_d0 +
                 (longdouble)-3.0 * lVar10 * lVar12 + (lVar9 + (longdouble)-2.0) * lVar10 * lVar11;
      lVar12 = lVar11 + lVar12;
      lVar6 = st + lVar4;
      lVar4 = lVar8;
    } while (lVar6 + 1U <= end);
    if (!NAN(lVar12)) goto LAB_0027c73e;
  }
  lVar4 = (end - st) + 1;
  lVar12 = (((longdouble)lVar4 + (longdouble)(float)(&DAT_0036e0d8)[lVar4 < 0]) / lVar12) *
           (local_dc / lVar12);
  uStack_a0 = (ushort)((unkuint10)lVar12 >> 0x40);
  local_a8 = SUB108(lVar12,0);
  if (((unkuint10)lVar12 & 0x7fff) != 0 &&
      (0x7ffd < (ushort)((uStack_a0 & 0x7fff) - 1) || -1 < local_a8)) {
    return -INFINITY;
  }
LAB_0027c841:
  if ((double)lVar12 <= 0.0) {
    return 0.0;
  }
  return (double)lVar12;
}

Assistant:

double calc_kurtosis(size_t ix_arr[], size_t st, size_t end, real_t x[], MissingAction missing_action)
{
    ldouble_safe m = 0;
    ldouble_safe M2 = 0, M3 = 0, M4 = 0;
    ldouble_safe delta, delta_s, delta_div;
    ldouble_safe diff, n;
    ldouble_safe out;

    if (missing_action == Fail)
    {
        for (size_t row = st; row <= end; row++)
        {
            n  =  (ldouble_safe)(row - st + 1);

            delta      =  x[ix_arr[row]] - m;
            delta_div  =  delta / n;
            delta_s    =  delta_div * delta_div;
            diff       =  delta * (delta_div * (ldouble_safe)(row - st));

            m   +=  delta_div;
            M4  +=  diff * delta_s * (n * n - 3 * n + 3) + 6 * delta_s * M2 - 4 * delta_div * M3;
            M3  +=  diff * delta_div * (n - 2) - 3 * delta_div * M2;
            M2  +=  diff;
        }

        if (unlikely(!is_na_or_inf(M2) && M2 <= 0))
        {
            if (!check_more_than_two_unique_values(ix_arr, st, end, x, missing_action))
                return -HUGE_VAL;
        }

        out = ( M4 / M2 ) * ( (ldouble_safe)(end - st + 1) / M2 );
        return (!is_na_or_inf(out))? std::fmax((double)out, 0.) : (-HUGE_VAL);
    }

    else
    {
        size_t cnt = 0;
        for (size_t row = st; row <= end; row++)
        {
            if (likely(!is_na_or_inf(x[ix_arr[row]])))
            {
                cnt++;
                n = (ldouble_safe) cnt;

                delta      =  x[ix_arr[row]] - m;
                delta_div  =  delta / n;
                delta_s    =  delta_div * delta_div;
                diff       =  delta * (delta_div * (ldouble_safe)(cnt - 1));

                m   +=  delta_div;
                M4  +=  diff * delta_s * (n * n - 3 * n + 3) + 6 * delta_s * M2 - 4 * delta_div * M3;
                M3  +=  diff * delta_div * (n - 2) - 3 * delta_div * M2;
                M2  +=  diff;
            }
        }

        if (unlikely(cnt == 0)) return -HUGE_VAL;
        if (unlikely(!is_na_or_inf(M2) && M2 <= 0))
        {
            if (!check_more_than_two_unique_values(ix_arr, st, end, x, missing_action))
                return -HUGE_VAL;
        }

        out = ( M4 / M2 ) * ( (ldouble_safe)cnt / M2 );
        return (!is_na_or_inf(out))? std::fmax((double)out, 0.) : (-HUGE_VAL);
    }
}